

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O0

size_t __thiscall
bidfx_public_api::tools::ByteBuffer::ReadBytes(ByteBuffer *this,OutputStream *output_buf,size_t len)

{
  byte bVar1;
  ulong local_28;
  size_t num_bytes;
  size_t len_local;
  OutputStream *output_buf_local;
  ByteBuffer *this_local;
  
  CheckBufferHasData(this,len);
  for (local_28 = 0; local_28 < len; local_28 = local_28 + 1) {
    bVar1 = GetNextByte(this);
    (**output_buf->_vptr_OutputStream)(output_buf,(ulong)bVar1);
  }
  return local_28;
}

Assistant:

size_t ByteBuffer::ReadBytes(OutputStream& output_buf, size_t len)
{
    CheckBufferHasData(len);
    size_t num_bytes = 0;
    for (; num_bytes < len; num_bytes++)
    {
        output_buf.WriteByte(GetNextByte());
    }
    return num_bytes;
}